

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O3

char16 * Js::OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)

{
  undefined8 *puVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,op) < 0x100) {
    puVar1 = (undefined8 *)(OpCodeAsmJsNames + (ulong)op * 8);
  }
  else {
    if (0x271 < op) {
      return L"<NotAvail>";
    }
    puVar1 = (undefined8 *)(ExtendedOpCodeAsmJsNames + (ulong)(op - 0x100) * 8);
  }
  return (char16 *)*puVar1;
}

Assistant:

char16 const * OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)
    {
        if (op <= Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            Assert(op < _countof(OpCodeAsmJsNames));
            __analysis_assume(op < _countof(OpCodeAsmJsNames));
            return OpCodeAsmJsNames[(int)op];
        }
        else if (op < Js::OpCodeAsmJs::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1);
            Assert(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            __analysis_assume(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            return ExtendedOpCodeAsmJsNames[opIndex];
        }
        return _u("<NotAvail>");
    }